

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O3

char * mi_stats_get_json(size_t output_size,char *output_buf)

{
  _Bool _Var1;
  mi_stat_counter_t mVar2;
  mi_stat_count_t *pmVar3;
  size_t i;
  mi_stat_count_t *pmVar4;
  size_t i_1;
  mi_heap_buf_t hbuf;
  size_t page_faults;
  size_t peak_commit;
  size_t current_commit;
  size_t peak_rss;
  size_t current_rss;
  size_t sys_time;
  char local_c8 [127];
  undefined1 local_49;
  size_t user_time;
  size_t elapsed;
  
  hbuf.used = 0;
  hbuf.can_realloc = true;
  hbuf._25_7_ = 0;
  hbuf.buf = (char *)0x0;
  hbuf.size = 0;
  if (output_buf == (char *)0x0 || output_size == 0) {
    _Var1 = mi_heap_buf_expand(&hbuf);
    if (!_Var1) {
      return (char *)0x0;
    }
  }
  else {
    memset(output_buf,0,output_size);
    hbuf._24_8_ = hbuf._24_8_ & 0xffffffffffffff00;
    hbuf.buf = output_buf;
    hbuf.size = output_size;
  }
  mi_heap_buf_print(&hbuf,"{\n");
  pmVar4 = (mi_stat_count_t *)0x0;
  _mi_snprintf(local_c8,0x80,"  \"%s\": %lld,\n","version",1);
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  _mi_snprintf(local_c8,0x80,"  \"%s\": %lld,\n","mimalloc_version",0xdf);
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  mi_heap_buf_print(&hbuf,"  \"process\": {\n");
  mi_process_info(&elapsed,&user_time,&sys_time,&current_rss,&peak_rss,&current_commit,&peak_commit,
                  &page_faults);
  _mi_snprintf(local_c8,0x80,"    \"%s\": %zu%s\n","elapsed_msecs",elapsed,",");
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  _mi_snprintf(local_c8,0x80,"    \"%s\": %zu%s\n","user_msecs",user_time,",");
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  _mi_snprintf(local_c8,0x80,"    \"%s\": %zu%s\n","system_msecs",sys_time,",");
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  _mi_snprintf(local_c8,0x80,"    \"%s\": %zu%s\n","page_faults",page_faults,",");
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  _mi_snprintf(local_c8,0x80,"    \"%s\": %zu%s\n","rss_current",current_rss,",");
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  _mi_snprintf(local_c8,0x80,"    \"%s\": %zu%s\n","rss_peak",peak_rss,",");
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  _mi_snprintf(local_c8,0x80,"    \"%s\": %zu%s\n","commit_current",current_commit,",");
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  _mi_snprintf(local_c8,0x80,"    \"%s\": %zu%s\n","commit_peak",peak_commit,"");
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  mi_heap_buf_print(&hbuf,"  },\n");
  mi_heap_buf_print_count_value(&hbuf,"pages",&_mi_stats_main.pages);
  mi_heap_buf_print_count_value(&hbuf,"reserved",&_mi_stats_main.reserved);
  mi_heap_buf_print_count_value(&hbuf,"committed",&_mi_stats_main.committed);
  mi_heap_buf_print_count_value(&hbuf,"reset",&_mi_stats_main.reset);
  mi_heap_buf_print_count_value(&hbuf,"purged",&_mi_stats_main.purged);
  mi_heap_buf_print_count_value(&hbuf,"page_committed",&_mi_stats_main.page_committed);
  mi_heap_buf_print_count_value(&hbuf,"pages_abandoned",&_mi_stats_main.pages_abandoned);
  mi_heap_buf_print_count_value(&hbuf,"threads",&_mi_stats_main.threads);
  mi_heap_buf_print_count_value(&hbuf,"malloc_normal",&_mi_stats_main.malloc_normal);
  mi_heap_buf_print_count_value(&hbuf,"malloc_huge",&_mi_stats_main.malloc_huge);
  mi_heap_buf_print_count_value(&hbuf,"malloc_requested",&_mi_stats_main.malloc_requested);
  _mi_snprintf(local_c8,0x80,"  \"%s\": %lld,\n","mmap_calls",_mi_stats_main.mmap_calls.total);
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  _mi_snprintf(local_c8,0x80,"  \"%s\": %lld,\n","commit_calls",_mi_stats_main.commit_calls.total);
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  _mi_snprintf(local_c8,0x80,"  \"%s\": %lld,\n","reset_calls",_mi_stats_main.reset_calls.total);
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  _mi_snprintf(local_c8,0x80,"  \"%s\": %lld,\n","purge_calls",_mi_stats_main.purge_calls.total);
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  _mi_snprintf(local_c8,0x80,"  \"%s\": %lld,\n","arena_count",_mi_stats_main.arena_count.total);
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  _mi_snprintf(local_c8,0x80,"  \"%s\": %lld,\n","malloc_normal_count",
               _mi_stats_main.malloc_normal_count.total);
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  _mi_snprintf(local_c8,0x80,"  \"%s\": %lld,\n","malloc_huge_count",
               _mi_stats_main.malloc_huge_count.total);
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  _mi_snprintf(local_c8,0x80,"  \"%s\": %lld,\n","malloc_guarded_count",
               _mi_stats_main.malloc_guarded_count.total);
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  _mi_snprintf(local_c8,0x80,"  \"%s\": %lld,\n","arena_rollback_count",
               _mi_stats_main.arena_rollback_count.total);
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  _mi_snprintf(local_c8,0x80,"  \"%s\": %lld,\n","arena_purges",_mi_stats_main.arena_purges.total);
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  _mi_snprintf(local_c8,0x80,"  \"%s\": %lld,\n","pages_extended",
               _mi_stats_main.pages_extended.total);
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  _mi_snprintf(local_c8,0x80,"  \"%s\": %lld,\n","pages_retire",_mi_stats_main.pages_retire.total);
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  _mi_snprintf(local_c8,0x80,"  \"%s\": %lld,\n","page_searches",_mi_stats_main.page_searches.total)
  ;
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  mi_heap_buf_print_count_value(&hbuf,"segments",&_mi_stats_main.segments);
  mi_heap_buf_print_count_value(&hbuf,"segments_abandoned",&_mi_stats_main.segments_abandoned);
  mi_heap_buf_print_count_value(&hbuf,"segments_cache",&_mi_stats_main.segments_cache);
  mi_heap_buf_print_count_value(&hbuf,"_segments_reserved",&_mi_stats_main._segments_reserved);
  _mi_snprintf(local_c8,0x80,"  \"%s\": %lld,\n","pages_reclaim_on_alloc",
               _mi_stats_main.pages_reclaim_on_alloc.total);
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  _mi_snprintf(local_c8,0x80,"  \"%s\": %lld,\n","pages_reclaim_on_free",
               _mi_stats_main.pages_reclaim_on_free.total);
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  _mi_snprintf(local_c8,0x80,"  \"%s\": %lld,\n","pages_reabandon_full",
               _mi_stats_main.pages_reabandon_full.total);
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  mVar2 = _mi_stats_main.pages_unabandon_busy_wait;
  _mi_snprintf(local_c8,0x80,"  \"%s\": %lld,\n","pages_unabandon_busy_wait");
  local_49 = 0;
  mi_heap_buf_print(&hbuf,local_c8);
  mi_heap_buf_print(&hbuf,"  \"malloc_bins\": [\n");
  pmVar3 = _mi_stats_main.malloc_bins;
  do {
    mi_heap_buf_print_count_bin
              (&hbuf,(char *)pmVar3,pmVar4,(ulong)(pmVar4 != (mi_stat_count_t *)0x49),
               SUB81(mVar2.total,0));
    pmVar4 = (mi_stat_count_t *)((long)&pmVar4->total + 1);
    pmVar3 = pmVar3 + 1;
  } while (pmVar4 != (mi_stat_count_t *)0x4a);
  mi_heap_buf_print(&hbuf,"  ],\n");
  mi_heap_buf_print(&hbuf,"  \"page_bins\": [\n");
  pmVar3 = _mi_stats_main.page_bins;
  pmVar4 = (mi_stat_count_t *)0x0;
  do {
    mi_heap_buf_print_count_bin
              (&hbuf,(char *)pmVar3,pmVar4,(ulong)(pmVar4 != (mi_stat_count_t *)0x49),
               SUB81(mVar2.total,0));
    pmVar4 = (mi_stat_count_t *)((long)&pmVar4->total + 1);
    pmVar3 = pmVar3 + 1;
  } while (pmVar4 != (mi_stat_count_t *)0x4a);
  mi_heap_buf_print(&hbuf,"  ]\n");
  mi_heap_buf_print(&hbuf,"}\n");
  return hbuf.buf;
}

Assistant:

char* mi_stats_get_json(size_t output_size, char* output_buf) mi_attr_noexcept {
  mi_heap_buf_t hbuf = { NULL, 0, 0, true };
  if (output_size > 0 && output_buf != NULL) {
    _mi_memzero(output_buf, output_size);
    hbuf.buf = output_buf;
    hbuf.size = output_size;
    hbuf.can_realloc = false;
  }
  else {
    if (!mi_heap_buf_expand(&hbuf)) return NULL;
  }
  mi_heap_buf_print(&hbuf, "{\n");
  mi_heap_buf_print_value(&hbuf, "version", MI_STAT_VERSION);
  mi_heap_buf_print_value(&hbuf, "mimalloc_version", MI_MALLOC_VERSION);

  // process info
  mi_heap_buf_print(&hbuf, "  \"process\": {\n");
  size_t elapsed;
  size_t user_time;
  size_t sys_time;
  size_t current_rss;
  size_t peak_rss;
  size_t current_commit;
  size_t peak_commit;
  size_t page_faults;
  mi_process_info(&elapsed, &user_time, &sys_time, &current_rss, &peak_rss, &current_commit, &peak_commit, &page_faults);
  mi_heap_buf_print_size(&hbuf, "elapsed_msecs", elapsed, true);
  mi_heap_buf_print_size(&hbuf, "user_msecs", user_time, true);
  mi_heap_buf_print_size(&hbuf, "system_msecs", sys_time, true);
  mi_heap_buf_print_size(&hbuf, "page_faults", page_faults, true);
  mi_heap_buf_print_size(&hbuf, "rss_current", current_rss, true);
  mi_heap_buf_print_size(&hbuf, "rss_peak", peak_rss, true);
  mi_heap_buf_print_size(&hbuf, "commit_current", current_commit, true);
  mi_heap_buf_print_size(&hbuf, "commit_peak", peak_commit, false);
  mi_heap_buf_print(&hbuf, "  },\n");

  // statistics
  mi_stats_t* stats = &_mi_stats_main;
  MI_STAT_FIELDS()

  // size bins
  mi_heap_buf_print(&hbuf, "  \"malloc_bins\": [\n");
  for (size_t i = 0; i <= MI_BIN_HUGE; i++) {
    mi_heap_buf_print_count_bin(&hbuf, "    ", &stats->malloc_bins[i], i, i!=MI_BIN_HUGE);
  }
  mi_heap_buf_print(&hbuf, "  ],\n");
  mi_heap_buf_print(&hbuf, "  \"page_bins\": [\n");
  for (size_t i = 0; i <= MI_BIN_HUGE; i++) {
    mi_heap_buf_print_count_bin(&hbuf, "    ", &stats->page_bins[i], i, i!=MI_BIN_HUGE);
  }
  mi_heap_buf_print(&hbuf, "  ]\n");
  mi_heap_buf_print(&hbuf, "}\n");
  return hbuf.buf;
}